

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcOffsetCurve3D::IfcOffsetCurve3D(IfcOffsetCurve3D *this)

{
  IfcOffsetCurve3D *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x68,"IfcOffsetCurve3D");
  IfcCurve::IfcCurve(&this->super_IfcCurve,&PTR_construction_vtable_24__00f7c918);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcOffsetCurve3D,_4UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcOffsetCurve3D,_4UL> *)
             &(this->super_IfcCurve).super_IfcGeometricRepresentationItem.field_0x30,
             &PTR_construction_vtable_24__00f7c990);
  (this->super_IfcCurve).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0xf7c860;
  *(undefined8 *)&this->field_0x68 = 0xf7c900;
  *(undefined8 *)
   &(this->super_IfcCurve).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0xf7c888;
  *(undefined8 *)
   &(this->super_IfcCurve).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0xf7c8b0;
  *(undefined8 *)&(this->super_IfcCurve).super_IfcGeometricRepresentationItem.field_0x30 = 0xf7c8d8;
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>::Lazy
            ((Lazy<Assimp::IFC::Schema_2x3::IfcCurve> *)&(this->super_IfcCurve).field_0x40,
             (LazyObject *)0x0);
  std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::shared_ptr(&this->SelfIntersect);
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>::Lazy(&this->RefDirection,(LazyObject *)0x0);
  return;
}

Assistant:

IfcOffsetCurve3D() : Object("IfcOffsetCurve3D") {}